

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crosser.cc
# Opt level: O0

int __thiscall S2EdgeCrosser::CrossingSignInternal(S2EdgeCrosser *this,S2Point *d)

{
  int iVar1;
  int result;
  S2Point *d_local;
  S2EdgeCrosser *this_local;
  
  iVar1 = CrossingSignInternal2(this,d);
  this->c_ = d;
  this->acb_ = -this->bda_;
  return iVar1;
}

Assistant:

int S2EdgeCrosser::CrossingSignInternal(const S2Point* d) {
  // Compute the actual result, and then save the current vertex D as the next
  // vertex C, and save the orientation of the next triangle ACB (which is
  // opposite to the current triangle BDA).
  int result = CrossingSignInternal2(*d);
  c_ = d;
  acb_ = -bda_;
  return result;
}